

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Destroy<duckdb::ArgMinMaxState<long,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  char *pcVar2;
  idx_t iVar3;
  
  if (count != 0) {
    pdVar1 = states->data;
    iVar3 = 0;
    do {
      pcVar2 = *(char **)(pdVar1 + iVar3 * 8);
      if (*pcVar2 == '\x01') {
        if ((0xc < *(uint *)(pcVar2 + 0x10)) && (*(void **)(pcVar2 + 0x18) != (void *)0x0)) {
          operator_delete__(*(void **)(pcVar2 + 0x18));
        }
        *pcVar2 = '\0';
      }
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  return;
}

Assistant:

static void Destroy(Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
		for (idx_t i = 0; i < count; i++) {
			OP::template Destroy<STATE_TYPE>(*sdata[i], aggr_input_data);
		}
	}